

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models.cpp
# Opt level: O3

void gl_RenderHUDModel(DPSprite *psp,float ofsX,float ofsY)

{
  int curTics;
  long lVar1;
  undefined8 *puVar2;
  FState *curState;
  PClass *pPVar3;
  FSpriteModelFrame *smf;
  Matrix3x4 *in_R8;
  
  lVar1 = (&DAT_00a60408)[(long)consoleplayer * 0x54];
  puVar2 = *(undefined8 **)(*(long *)(lVar1 + 0x200) + 0xd0);
  pPVar3 = (PClass *)puVar2[1];
  if (pPVar3 == (PClass *)0x0) {
    pPVar3 = (PClass *)(**(code **)*puVar2)(puVar2);
    puVar2[1] = pPVar3;
  }
  smf = gl_FindModelFrame(pPVar3,(uint)psp->State->sprite,(uint)psp->State->Frame,false);
  if (smf != (FSpriteModelFrame *)0x0) {
    (*_ptrc_glDepthFunc)(0x203);
    if (*(uint32 *)(lVar1 + 0xe8) != LegacyRenderStyles[1].AsDWORD) {
      (*_ptrc_glEnable)(0xb44);
      (*_ptrc_glFrontFace)(0x901);
    }
    VSMatrix::loadIdentity(&gl_RenderState.mViewMatrix);
    VSMatrix::scale(&gl_RenderState.mViewMatrix,smf->xscale,smf->zscale,smf->yscale);
    VSMatrix::translate(&gl_RenderState.mViewMatrix,smf->xoffset / smf->xscale,
                        smf->zoffset / smf->zscale,smf->yoffset / smf->yscale);
    VSMatrix::rotate(&gl_RenderState.mViewMatrix,ofsX * 0.25,0.0,1.0,0.0);
    VSMatrix::rotate(&gl_RenderState.mViewMatrix,ofsY * -0.25 + 8.09375,1.0,0.0,0.0);
    VSMatrix::rotate(&gl_RenderState.mViewMatrix,90.0,0.0,1.0,0.0);
    VSMatrix::rotate(&gl_RenderState.mViewMatrix,-smf->angleoffset,0.0,1.0,0.0);
    VSMatrix::rotate(&gl_RenderState.mViewMatrix,smf->pitchoffset,0.0,0.0,1.0);
    VSMatrix::rotate(&gl_RenderState.mViewMatrix,-smf->rolloffset,1.0,0.0,0.0);
    FRenderState::ApplyMatrices(&gl_RenderState);
    curState = psp->State;
    curTics = psp->Tics;
    puVar2 = *(undefined8 **)(*(long *)(lVar1 + 0x200) + 0xd0);
    pPVar3 = (PClass *)puVar2[1];
    if (pPVar3 == (PClass *)0x0) {
      pPVar3 = (PClass *)(**(code **)*puVar2)(puVar2);
      puVar2[1] = pPVar3;
    }
    gl_RenderFrameModels(smf,curState,curTics,pPVar3,in_R8,0);
    (*_ptrc_glDepthFunc)(0x201);
    if (*(uint32 *)(lVar1 + 0xe8) != LegacyRenderStyles[1].AsDWORD) {
      (*_ptrc_glDisable)(0xb44);
      return;
    }
  }
  return;
}

Assistant:

void gl_RenderHUDModel(DPSprite *psp, float ofsX, float ofsY)
{
	AActor * playermo=players[consoleplayer].camera;
	FSpriteModelFrame *smf = gl_FindModelFrame(playermo->player->ReadyWeapon->GetClass(), psp->GetState()->sprite, psp->GetState()->GetFrame(), false);

	// [BB] No model found for this sprite, so we can't render anything.
	if ( smf == nullptr )
		return;

	glDepthFunc(GL_LEQUAL);

	// [BB] In case the model should be rendered translucent, do back face culling.
	// This solves a few of the problems caused by the lack of depth sorting.
	// TO-DO: Implement proper depth sorting.
	if (!( playermo->RenderStyle == LegacyRenderStyles[STYLE_Normal] ))
	{
		glEnable(GL_CULL_FACE);
		glFrontFace(GL_CCW);
	}

	// [BB] The model has to be drawn independently from the position of the player,
	// so we have to reset the view matrix.
	gl_RenderState.mViewMatrix.loadIdentity();

	// Scaling model (y scale for a sprite means height, i.e. z in the world!).
	gl_RenderState.mViewMatrix.scale(smf->xscale, smf->zscale, smf->yscale);
	
	// Aplying model offsets (model offsets do not depend on model scalings).
	gl_RenderState.mViewMatrix.translate(smf->xoffset / smf->xscale, smf->zoffset / smf->zscale, smf->yoffset / smf->yscale);

	// [BB] Weapon bob, very similar to the normal Doom weapon bob.
	gl_RenderState.mViewMatrix.rotate(ofsX/4, 0, 1, 0);
	gl_RenderState.mViewMatrix.rotate((ofsY-WEAPONTOP)/-4., 1, 0, 0);

	// [BB] For some reason the jDoom models need to be rotated.
	gl_RenderState.mViewMatrix.rotate(90.f, 0, 1, 0);

	// Applying angleoffset, pitchoffset, rolloffset.
	gl_RenderState.mViewMatrix.rotate(-smf->angleoffset, 0, 1, 0);
	gl_RenderState.mViewMatrix.rotate(smf->pitchoffset, 0, 0, 1);
	gl_RenderState.mViewMatrix.rotate(-smf->rolloffset, 1, 0, 0);
	gl_RenderState.ApplyMatrices();

	gl_RenderFrameModels( smf, psp->GetState(), psp->GetTics(), playermo->player->ReadyWeapon->GetClass(), nullptr, 0 );

	glDepthFunc(GL_LESS);
	if (!( playermo->RenderStyle == LegacyRenderStyles[STYLE_Normal] ))
		glDisable(GL_CULL_FACE);
}